

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

void roaring_bitmap_rank_many(roaring_bitmap_t *bm,uint32_t *begin,uint32_t *end,uint64_t *ans)

{
  uint8_t uVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  array_container_t *arr;
  uint64_t start_rank;
  
  lVar4 = 0;
  start_rank = 0;
  do {
    lVar4 = (long)(int)lVar4;
    while( true ) {
      if (((bm->high_low_container).size <= (int)lVar4) || (begin == end)) {
        return;
      }
      uVar3 = (uint)(bm->high_low_container).keys[lVar4];
      if (*begin >> 0x10 <= uVar3) break;
      iVar2 = container_get_cardinality
                        ((bm->high_low_container).containers[lVar4],
                         (bm->high_low_container).typecodes[lVar4]);
      start_rank = start_rank + (long)iVar2;
      lVar4 = lVar4 + 1;
    }
    if (*begin >> 0x10 == uVar3) {
      arr = (array_container_t *)(bm->high_low_container).containers[lVar4];
      uVar1 = (bm->high_low_container).typecodes[lVar4];
      if (uVar1 == '\x04') {
        uVar1 = *(uint8_t *)&arr->array;
        arr = *(array_container_t **)arr;
      }
      if (uVar1 == '\x03') {
        uVar3 = run_container_rank_many((run_container_t *)arr,start_rank,begin,end,ans);
      }
      else if (uVar1 == '\x02') {
        uVar3 = array_container_rank_many(arr,start_rank,begin,end,ans);
      }
      else {
        uVar3 = bitset_container_rank_many((bitset_container_t *)arr,start_rank,begin,end,ans);
      }
      begin = begin + uVar3;
      ans = ans + uVar3;
    }
    else {
      *ans = start_rank;
      ans = ans + 1;
      begin = begin + 1;
    }
  } while( true );
}

Assistant:

void roaring_bitmap_rank_many(const roaring_bitmap_t *bm, const uint32_t *begin,
                              const uint32_t *end, uint64_t *ans) {
    uint64_t size = 0;

    int i = 0;
    const uint32_t *iter = begin;
    while (i < bm->high_low_container.size && iter != end) {
        uint32_t x = *iter;
        uint32_t xhigh = x >> 16;
        uint32_t key = bm->high_low_container.keys[i];
        if (xhigh > key) {
            size +=
                container_get_cardinality(bm->high_low_container.containers[i],
                                          bm->high_low_container.typecodes[i]);
            i++;
        } else if (xhigh == key) {
            uint32_t consumed = container_rank_many(
                bm->high_low_container.containers[i],
                bm->high_low_container.typecodes[i], size, iter, end, ans);
            iter += consumed;
            ans += consumed;
        } else {
            *(ans++) = size;
            iter++;
        }
    }
}